

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void ON_SubDEdgeChain::ReverseEdgeChain(ON_SubDEdgePtr *edge_chain,size_t edge_count)

{
  ON_SubDEdgePtr OVar1;
  ON_SubDEdgePtr OVar2;
  ON_SubDEdgePtr eptr;
  ON_SubDEdgePtr *p1;
  ON_SubDEdgePtr *p0;
  size_t edge_count_local;
  ON_SubDEdgePtr *edge_chain_local;
  
  if ((edge_count != 0) && (edge_chain != (ON_SubDEdgePtr *)0x0)) {
    eptr.m_ptr = (ON__UINT_PTR)(edge_chain + (edge_count - 1));
    for (p1 = edge_chain; p1 < eptr.m_ptr; p1 = p1 + 1) {
      OVar1 = ON_SubDEdgePtr::Reversed(p1);
      OVar2 = ON_SubDEdgePtr::Reversed(eptr.m_ptr);
      p1->m_ptr = (ON__UINT_PTR)OVar2;
      *(ON__UINT_PTR *)eptr.m_ptr = OVar1.m_ptr;
      eptr.m_ptr = eptr.m_ptr - 8;
    }
    if (p1 == (ON_SubDEdgePtr *)eptr.m_ptr) {
      OVar1 = ON_SubDEdgePtr::Reversed(p1);
      p1->m_ptr = (ON__UINT_PTR)OVar1;
    }
  }
  return;
}

Assistant:

void ON_SubDEdgeChain::ReverseEdgeChain(
  ON_SubDEdgePtr* edge_chain,
  size_t edge_count
  )
{
  if (edge_count <= 0 || nullptr == edge_chain)
    return;
  ON_SubDEdgePtr* p0 = edge_chain;
  ON_SubDEdgePtr* p1 = p0 + (edge_count - 1);
  while ( p0 < p1)
  {
    ON_SubDEdgePtr eptr = p0->Reversed();
    *p0 = p1->Reversed();
    *p1 = eptr;
    ++p0;
    --p1;
  }
  if (p0 == p1)
    *p0 = p0->Reversed();
}